

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

int css_seas(double *inp,int N,int optmethod,int p,int d,int q,int s,int P,int D,int Q,double *phi,
            double *theta,double *PHI,double *THETA,double *wmean,double *var,double *loglik,
            double *hess)

{
  int N_00;
  int iVar1;
  double *oup;
  double *xi;
  double *xf;
  double *col;
  double *dx_00;
  int *ipiv_00;
  double *oup_00;
  double dVar2;
  undefined1 local_98 [8];
  custom_function css_min;
  alik_css_seas_object obj;
  double maxstep;
  int *ipiv;
  double *thess;
  double *dx;
  double *inp2;
  double *x;
  double *tf;
  double *b;
  int ret;
  int offset;
  int length;
  int retval;
  int pq;
  int i;
  int q_local;
  int d_local;
  int p_local;
  int optmethod_local;
  int N_local;
  double *inp_local;
  
  oup = (double *)malloc((long)(N - s * D) << 3);
  css_min.params = alik_css_seas_init(p,d,q,s,P,D,Q,N);
  N_00 = ((alik_css_seas_object)css_min.params)->pq;
  xi = (double *)malloc((long)N_00 << 3);
  xf = (double *)malloc((long)N_00 << 3);
  col = (double *)malloc((long)N_00 * 8 * (long)N_00);
  dx_00 = (double *)malloc((long)N_00 << 3);
  ipiv_00 = (int *)malloc((long)N_00 << 2);
  if (D < 1) {
    for (retval = 0; p_local = N, retval < N; retval = retval + 1) {
      oup[retval] = inp[retval];
    }
  }
  else {
    p_local = diffs(inp,N,D,s,oup);
  }
  oup_00 = (double *)malloc((long)(p_local - d) << 3);
  if (d < 1) {
    for (retval = 0; retval < p_local; retval = retval + 1) {
      oup_00[retval] = oup[retval];
    }
  }
  else {
    p_local = diff(oup,p_local,d,oup_00);
  }
  *(int *)((long)css_min.params + 0x28) = p_local;
  iVar1 = *(int *)((long)css_min.params + 0x50);
  for (retval = 0; retval < p; retval = retval + 1) {
    xi[retval] = 0.0;
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    xi[p + retval] = 0.0;
  }
  for (retval = 0; retval < P; retval = retval + 1) {
    xi[p + q + retval] = 0.0;
  }
  for (retval = 0; retval < Q; retval = retval + 1) {
    xi[p + q + P + retval] = 0.0;
  }
  if (*(int *)((long)css_min.params + 0x2c) == 1) {
    dVar2 = mean(oup_00,p_local);
    xi[p + q + P + Q] = dVar2;
    *wmean = xi[p + q + P + Q];
  }
  else {
    *wmean = 0.0;
  }
  *(double *)((long)css_min.params + 0x38) = *wmean;
  for (retval = 0; retval < p_local; retval = retval + 1) {
    dVar2 = oup_00[retval];
    *(double *)((long)css_min.params + (long)(iVar1 + p_local * 2 + retval) * 8 + 0x58) = dVar2;
    *(double *)((long)css_min.params + (long)(iVar1 + retval) * 8 + 0x58) = dVar2;
  }
  for (retval = p_local; SBORROW4(retval,p_local * 2) != retval + p_local * -2 < 0;
      retval = retval + 1) {
    *(undefined8 *)((long)css_min.params + (long)(iVar1 + retval) * 8 + 0x58) = 0;
  }
  local_98 = (undefined1  [8])fcss_seas;
  css_min.funcpt = (_func_double_double_ptr_int_void_ptr *)css_min.params;
  iVar1 = fminunc((custom_function *)local_98,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  if (iVar1 == 0) {
    b._4_4_ = 0;
  }
  else if (iVar1 == 0xf) {
    b._4_4_ = 0xf;
  }
  else if (iVar1 == 4) {
    b._4_4_ = 4;
  }
  else {
    b._4_4_ = 1;
  }
  for (retval = 0; retval < N_00; retval = retval + 1) {
    dx_00[retval] = 1.0;
  }
  hessian_fd((custom_function *)local_98,xf,N_00,dx_00,*(double *)((long)css_min.params + 0x30),hess
            );
  mtranspose(hess,N_00,N_00,col);
  for (retval = 0; retval < N_00 * N_00; retval = retval + 1) {
    col[retval] = (double)((p_local - d) - s * D) * 0.5 * (hess[retval] + col[retval]);
  }
  ludecomp(col,N_00,ipiv_00);
  minverse(col,N_00,ipiv_00,hess);
  for (retval = 0; retval < p; retval = retval + 1) {
    phi[retval] = xf[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    theta[retval] = -xf[p + retval];
  }
  for (retval = 0; retval < P; retval = retval + 1) {
    PHI[retval] = xf[p + q + retval];
  }
  for (retval = 0; retval < Q; retval = retval + 1) {
    THETA[retval] = -xf[p + q + P + retval];
  }
  if (*(int *)((long)css_min.params + 0x2c) == 1) {
    *wmean = xf[p + q + Q + P];
  }
  else {
    *wmean = 0.0;
  }
  *var = *(double *)((long)css_min.params + 0x40) / (double)p_local;
  *loglik = *(double *)((long)css_min.params + 0x48);
  free(xi);
  free(xf);
  free(oup);
  free(oup_00);
  free(col);
  free(dx_00);
  free(ipiv_00);
  free_alik_css_seas((alik_css_seas_object)css_min.params);
  return b._4_4_;
}

Assistant:

int css_seas(double *inp, int N, int optmethod, int p, int d, int q, int s, int P, int D, int Q,
	double *phi, double *theta, double *PHI, double *THETA, double *wmean, double *var,double *loglik,double *hess) {
	int i, pq, retval, length, offset,ret;
	double *b, *tf, *x, *inp2,*dx,*thess;
	int *ipiv;
	double maxstep;
	alik_css_seas_object obj;
	//custom_function as154_min;

	inp2 = (double*)malloc(sizeof(double)* (N - s*D));

	length = N;

	maxstep = 1.0;

	obj = alik_css_seas_init(p, d, q, s, P, D, Q, N);

	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);
	thess = (double*)malloc(sizeof(double)* pq*pq);
	dx = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);
	/*

	*/

	if (D > 0) {
		N = diffs(inp, N, D, s, inp2);
	}
	else {
		for (i = 0; i < N; ++i) {
			inp2[i] = inp[i];
		}
	}

	x = (double*)malloc(sizeof(double)* (N - d));

	if (d > 0) {
		N = diff(inp2, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp2[i];
		}
	}

	obj->N = N;

	offset = obj->offset;
	// Test

	for (i = 0; i < p; ++i) {
		b[i] = 0.0;
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = 0.0;
	}
	for (i = 0; i < P; ++i) {
		b[p + q + i] = 0.0;
	}
	for (i = 0; i < Q; ++i) {
		b[p + q + P + i] = 0.0;
	}

	if (obj->M == 1) {
		b[p + q + P + Q] = mean(x, N);
		*wmean = b[p + q + P + Q];
	}
	else {
		*wmean = 0.0;
	}

	obj->mean = *wmean;

	//mdisplay(b, 1, p + q + P + Q);

	for (i = 0; i < N; ++i) {
		obj->x[offset + i] = obj->x[offset + 2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[offset + i] = 0.0;
	}

	custom_function css_min = { fcss_seas, obj };
	retval = fminunc(&css_min, NULL, pq, b, maxstep, optmethod, tf);
	if (retval == 0) {
		ret = 0;
	}
	else if (retval == 15) {
		ret = 15;
	}
	else if (retval == 4) {
		ret = 4;
	}
	else {
		ret = 1;
	}

	for (i = 0; i < pq; ++i) {
		dx[i] = 1.0;
	}

	hessian_fd(&css_min, tf, pq, dx, obj->eps, hess);

	mtranspose(hess, pq, pq, thess);

	for (i = 0; i < pq*pq; ++i) {
		thess[i] = (N - d - s*D) * 0.5 * (hess[i] + thess[i]);
	}


	ludecomp(thess, pq, ipiv);
	minverse(thess, pq, ipiv, hess);

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = -tf[p + i];
	}
	for (i = 0; i < P; ++i) {
		PHI[i] = tf[p + q + i];
	}
	for (i = 0; i < Q; ++i) {
		THETA[i] = -tf[p + q + P + i];
	}

	if (obj->M == 1) {
		*wmean = tf[p + q + Q + P];
	}
	else {
		*wmean = 0.0;
	}
	
	/*
	wmean = 0.0;
	for (i = 0; i < N; ++i) {
	wmean += (obj->x[N + i] * obj->x[N + i]);
	}*/

	*var = (obj->ssq) / (double)N;
	*loglik = obj->loglik;
	//printf("MEAN %g \n", mean(obj->x+N,N));
	//mdisplay(obj->x + N, 1, N);

	free(b);
	free(tf);
	free(inp2);
	free(x);
	free(thess);
	free(dx);
	free(ipiv);
	free_alik_css_seas(obj);
	return ret;
}